

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O2

void __thiscall
de::
SharedPtrState<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>,_de::DefaultDeleter<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>
::deletePtr(SharedPtrState<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>,_de::DefaultDeleter<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>
            *this)

{
  DefaultDeleter<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>::operator()
            ((DefaultDeleter<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_> *)
             &this->field_0x18,this->m_ptr);
  this->m_ptr = (Move<vk::Handle<(vk::HandleType)18>_> *)0x0;
  return;
}

Assistant:

virtual void deletePtr (void) throw()
	{
		m_deleter(m_ptr);
		m_ptr = DE_NULL;
	}